

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.cpp
# Opt level: O3

void __thiscall Card::Card(Card *this,string *n,int t)

{
  this->_vptr_Card = (_func_int **)&PTR_effectBonus_00118120;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->tapped = false;
  this->type = t;
  return;
}

Assistant:

Card::Card(string n, int t)
{
    name = n;
    tapped = false;
    type = Type(t);
}